

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

void __thiscall ColorPrimariesNTSC1953::ColorPrimariesNTSC1953(ColorPrimariesNTSC1953 *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  allocator_type local_f2;
  allocator_type local_f1;
  _Vector_base<float,_std::allocator<float>_> local_f0;
  ColorPrimaryTransform local_d4;
  _Vector_base<float,_std::allocator<float>_> local_b0;
  float local_98 [12];
  float local_68 [11];
  ColorPrimaryTransform local_3c;
  
  local_68[4] = 0.586421;
  local_68[5] = 0.114612;
  local_68[6] = 0.0;
  local_68[7] = 0.066076;
  local_68[0] = 0.606993;
  local_68[1] = 0.173449;
  local_68[2] = 0.200571;
  local_68[3] = 0.298967;
  local_68[8] = 1.117469;
  __l._M_len = 9;
  __l._M_array = local_68;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_f0,__l,&local_f1);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&local_d4,(vector<float,_std::allocator<float>_> *)&local_f0);
  local_98[4] = 1.999777;
  local_98[5] = -0.028317;
  local_98[6] = 0.058241;
  local_98[7] = -0.118246;
  local_98[0] = 1.909675;
  local_98[1] = -0.532365;
  local_98[2] = -0.288161;
  local_98[3] = -0.984965;
  local_98[8] = 0.896554;
  __l_00._M_len = 9;
  __l_00._M_array = local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_b0,__l_00,&local_f2);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&local_3c,(vector<float,_std::allocator<float>_> *)&local_b0);
  (this->super_ColorPrimaries).toXYZ.matrix[2][2] = local_d4.matrix[2][2];
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[1] + 1) = local_d4.matrix[1]._4_8_;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[2] = local_d4.matrix[2]._0_8_;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[0] = local_d4.matrix[0]._0_8_;
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[0] + 2) = local_d4.matrix._8_8_;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[0] = local_3c.matrix[0]._0_8_;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[0] + 2) = local_3c.matrix._8_8_;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[1] + 1) = local_3c.matrix[1]._4_8_;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[2] = local_3c.matrix[2]._0_8_;
  (this->super_ColorPrimaries).fromXYZ.matrix[2][2] = local_3c.matrix[2][2];
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_b0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_f0);
  return;
}

Assistant:

ColorPrimariesNTSC1953() : ColorPrimaries(
        ColorPrimaryTransform({
            +0.606993f, +0.173449f, +0.200571f,
            +0.298967f, +0.586421f, +0.114612f,
            +0.000000f, +0.066076f, +1.117469f
        }),
        ColorPrimaryTransform({
            +1.909675f, -0.532365f, -0.288161f,
            -0.984965f, +1.999777f, -0.028317f,
            +0.058241f, -0.118246f, +0.896554f
        })
    ) {}